

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testRemotelyControlledSampler_Test::TestBody
          (Sampler_testRemotelyControlledSampler_Test *this)

{
  bool bVar1;
  result_type rVar2;
  element_type *peVar3;
  type pLVar4;
  type pMVar5;
  rep rVar6;
  result_type_conflict high;
  result_type_conflict low;
  char *pcVar7;
  int local_2114;
  duration<long,_std::ratio<1L,_1000L>_> local_2110;
  uint local_2104;
  AssertionResult local_2100 [2];
  AssertHelper local_20e0 [8];
  Message local_20d8 [15];
  allocator local_20c9;
  string local_20c8 [32];
  SamplingStatus local_20a8;
  bool local_2081;
  undefined1 local_2080 [8];
  AssertionResult gtest_ar_;
  TraceID traceID;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2058;
  duration<long,_std::ratio<1L,_1L>_> local_2050;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2048;
  time_point startTime;
  mt19937_64 rng;
  random_device device;
  duration<long,_std::ratio<1L,_1000L>_> local_2e8;
  int local_2dc;
  duration<long,_std::ratio<1L,_1000L>_> local_2d8;
  duration<long,std::ratio<1l,1000000000l>> local_2d0 [8];
  shared_ptr<jaegertracing::samplers::ProbabilisticSampler> local_2c8;
  shared_ptr<jaegertracing::samplers::Sampler> local_2b8;
  IPAddress local_2a8;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator local_1d9;
  string local_1d8 [32];
  RemotelyControlledSampler local_1b8 [8];
  RemotelyControlledSampler sampler;
  ProbabilisticSamplingStrategy local_c8 [8];
  ProbabilisticSamplingStrategy probaStrategy;
  SamplingStrategyResponse local_b8 [8];
  SamplingStrategyResponse config;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  local_40;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  undefined1 local_20 [8];
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  Sampler_testRemotelyControlledSampler_Test *this_local;
  
  mockAgent.super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  testutils::MockAgent::make();
  std::
  __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_20);
  jaegertracing::testutils::MockAgent::start();
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse(local_b8);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
            ((type)local_b8);
  sampling_manager::thrift::ProbabilisticSamplingStrategy::ProbabilisticSamplingStrategy(local_c8);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(1.0);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)local_b8);
  peVar3 = std::
           __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  testutils::MockAgent::
  addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
            (peVar3,(char (*) [13])"test-service",local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"test-service",&local_1d9);
  peVar3 = std::
           __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  testutils::MockAgent::samplingServerAddress(&local_2a8,peVar3);
  net::IPAddress::authority_abi_cxx11_(&local_220,&local_2a8);
  std::operator+(&local_200,"http://",&local_220);
  std::make_shared<jaegertracing::samplers::ProbabilisticSampler,double_const&>
            ((double *)&local_2c8);
  std::shared_ptr<jaegertracing::samplers::Sampler>::
  shared_ptr<jaegertracing::samplers::ProbabilisticSampler,void>(&local_2b8,&local_2c8);
  local_2dc = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_2d8,&local_2dc);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            (local_2d0,&local_2d8);
  pLVar4 = std::
           unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
           ::operator*((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                        *)&metrics);
  pMVar5 = std::
           unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           ::operator*(&local_40);
  jaegertracing::samplers::RemotelyControlledSampler::RemotelyControlledSampler
            (local_1b8,local_1d8,(string *)&local_200,(shared_ptr *)&local_2b8,10,
             (duration *)local_2d0,pLVar4,pMVar5);
  std::shared_ptr<jaegertracing::samplers::Sampler>::~shared_ptr(&local_2b8);
  std::shared_ptr<jaegertracing::samplers::ProbabilisticSampler>::~shared_ptr(&local_2c8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  device.field_0._4996_4_ = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_2e8,
             (int *)((long)&device.field_0 + 0x1384));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_2e8);
  std::random_device::random_device((random_device *)&rng._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&startTime);
  rVar2 = std::random_device::operator()((random_device *)&rng._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *)&startTime,(ulong)rVar2);
  local_2048.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  while( true ) {
    traceID._low = std::chrono::_V2::steady_clock::now();
    local_2058.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&traceID._low,&local_2048);
    local_2050.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                        (&local_2058);
    rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_2050);
    if (0 < rVar6) break;
    high = std::
           mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
           ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                         *)&startTime);
    low = std::
          mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)&startTime);
    TraceID::TraceID((TraceID *)&gtest_ar_.message_,high,low);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_20c8,"op",&local_20c9);
    jaegertracing::samplers::RemotelyControlledSampler::isSampled
              ((TraceID *)&local_20a8,(string *)local_1b8);
    local_2081 = SamplingStatus::isSampled(&local_20a8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2080,&local_2081,(type *)0x0);
    SamplingStatus::~SamplingStatus(&local_20a8);
    std::__cxx11::string::~string(local_20c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_20c9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2080);
    if (!bVar1) {
      testing::Message::Message(local_20d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_2100,local_2080,"sampler.isSampled(traceID, kTestOperationName).isSampled()",
                 "false");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_20e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x16d,pcVar7);
      testing::internal::AssertHelper::operator=(local_20e0,local_20d8);
      testing::internal::AssertHelper::~AssertHelper(local_20e0);
      std::__cxx11::string::~string((string *)local_2100);
      testing::Message::~Message(local_20d8);
    }
    local_2104 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2080);
    if (local_2104 != 0) goto LAB_003057c9;
    local_2114 = 0x14;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_2110,&local_2114);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_2110);
  }
  jaegertracing::samplers::RemotelyControlledSampler::close();
  local_2104 = 0;
LAB_003057c9:
  std::random_device::~random_device((random_device *)&rng._M_p);
  RemotelyControlledSampler::~RemotelyControlledSampler(local_1b8);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
  ~ProbabilisticSamplingStrategy(local_c8);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
            (local_b8);
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&local_40);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
               *)&metrics);
  std::shared_ptr<jaegertracing::testutils::MockAgent>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::MockAgent> *)local_20);
  return;
}

Assistant:

TEST(Sampler, testRemotelyControlledSampler)
{
    const auto mockAgent = testutils::MockAgent::make();
    mockAgent->start();
    const auto logger = logging::nullLogger();
    const auto metrics = metrics::Metrics::makeNullMetrics();
            
    // Make sure remote sampling probability is 1
    sampling_manager::thrift::SamplingStrategyResponse config;
    config.__set_strategyType(
        sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC);
    sampling_manager::thrift::ProbabilisticSamplingStrategy probaStrategy;
    probaStrategy.__set_samplingRate(1.0);
    config.__set_probabilisticSampling(probaStrategy);
    mockAgent->addSamplingStrategy("test-service", config);

    // Default probability of 0.5, switches to 1 when downloaded
    RemotelyControlledSampler sampler(
        "test-service",
        "http://" + mockAgent->samplingServerAddress().authority(),
        std::make_shared<ProbabilisticSampler>(kTestDefaultSamplingProbability),
        kTestDefaultMaxOperations,
        std::chrono::milliseconds(100),
        *logger,
        *metrics);
    
    // Wait a bit for remote config download to be done
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    std::random_device device;
    std::mt19937_64 rng;
    rng.seed(device());
    for (auto startTime = RemotelyControlledSampler::Clock::now();
         std::chrono::duration_cast<std::chrono::seconds>(
             RemotelyControlledSampler::Clock::now() - startTime)
             .count() < 1;) {
        TraceID traceID(rng(), rng());
        // If probability was 0.5 we could reasonnably assume one of 50 samples fail
        ASSERT_TRUE(sampler.isSampled(traceID, kTestOperationName).isSampled());
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    sampler.close();
}